

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void close_local_endpoint(connection *conn)

{
  mg_connection *conn_00;
  uint *puVar1;
  endpoint_type eVar2;
  int iVar3;
  ns_connection *pnVar4;
  int iVar5;
  FILE *__stream;
  tm *__tp;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  mg_connection *c;
  time_t local_e0;
  char date [64];
  char user [100];
  
  conn_00 = &conn->mg_conn;
  iVar5 = should_keep_alive(conn_00);
  eVar2 = conn->endpoint_type;
  switch(eVar2) {
  case EP_FILE:
  case EP_PUT:
    close((conn->endpoint).fd);
    break;
  case EP_CGI:
  case EP_PROXY:
    if ((conn->endpoint).nc != (ns_connection *)0x0) {
      puVar1 = &((conn->endpoint).nc)->flags;
      *(byte *)puVar1 = (byte)*puVar1 | 0x10;
      ((conn->endpoint).nc)->user_data = (void *)0x0;
    }
  }
  iVar3 = (conn->mg_conn).status_code;
  if ((((0 < iVar3) && (iVar3 != 400)) && (conn->endpoint_type != EP_CLIENT)) &&
     ((pcVar12 = conn->server->config_options[1], pcVar12 != (char *)0x0 &&
      (__stream = fopen64(pcVar12,"a+"), __stream != (FILE *)0x0)))) {
    local_e0 = time((time_t *)0x0);
    __tp = localtime(&local_e0);
    strftime(date,0x40,"%d/%b/%Y:%H:%M:%S %z",__tp);
    flockfile(__stream);
    pcVar6 = mg_get_header(conn_00,"Authorization");
    pcVar12 = user;
    mg_parse_header(pcVar6,"username",pcVar12,100);
    if (user[0] == '\0') {
      pcVar12 = "-";
    }
    pcVar6 = (conn->mg_conn).request_method;
    pcVar9 = (conn->mg_conn).uri;
    if (pcVar6 == (char *)0x0) {
      pcVar6 = "-";
    }
    if (pcVar9 == (char *)0x0) {
      pcVar9 = "-";
    }
    pcVar10 = (conn->mg_conn).query_string;
    pcVar11 = "?";
    if (pcVar10 == (char *)0x0) {
      pcVar11 = "";
    }
    if (pcVar10 == (char *)0x0) {
      pcVar10 = "";
    }
    fprintf(__stream,"%s - %s [%s] \"%s %s%s%s HTTP/%s\" %d 0",(conn->mg_conn).remote_ip,pcVar12,
            date,pcVar6,pcVar9,pcVar11,pcVar10,(conn->mg_conn).http_version,
            (ulong)(uint)(conn->mg_conn).status_code);
    log_header(conn_00,"Referer",(FILE *)__stream);
    log_header(conn_00,"User-Agent",(FILE *)__stream);
    fputc(10,__stream);
    fflush(__stream);
    funlockfile(__stream);
    fclose(__stream);
  }
  iobuf_free(&conn->ns_conn->recv_iobuf);
  free(conn->request);
  free(conn->path_info);
  (conn->endpoint).nc = (ns_connection *)0x0;
  conn->endpoint_type = EP_NONE;
  conn->path_info = (char *)0x0;
  conn->request = (char *)0x0;
  conn->num_bytes_recv = 0;
  conn->cl = 0;
  conn->request_len = 0;
  pnVar4 = conn->ns_conn;
  uVar7 = pnVar4->flags & 0xffcfffec;
  pnVar4->flags = uVar7;
  (conn->mg_conn).num_headers = 0;
  (conn->mg_conn).http_version = (char *)0x0;
  (conn->mg_conn).query_string = (char *)0x0;
  conn_00->request_method = (char *)0x0;
  (conn->mg_conn).uri = (char *)0x0;
  (conn->mg_conn).content_len = 0;
  (conn->mg_conn).is_websocket = 0;
  (conn->mg_conn).status_code = 0;
  (conn->mg_conn).connection_param = (void *)0x0;
  (conn->mg_conn).callback_param = (void *)0x0;
  if (iVar5 == 0 || (eVar2 & ~EP_CGI) != EP_FILE) {
    uVar8 = 1;
    if ((pnVar4->send_iobuf).len == 0) {
      uVar8 = 0x10;
    }
    pnVar4->flags = uVar8 | uVar7;
  }
  else {
    on_recv_data(conn);
  }
  return;
}

Assistant:

static void close_local_endpoint(struct connection *conn) {
  struct mg_connection *c = &conn->mg_conn;
  // Must be done before free()
  int keep_alive = should_keep_alive(&conn->mg_conn) &&
    (conn->endpoint_type == EP_FILE || conn->endpoint_type == EP_USER);
  DBG(("%p %d %d %d", conn, conn->endpoint_type, keep_alive,
       conn->ns_conn->flags));

  switch (conn->endpoint_type) {
    case EP_PUT:
    case EP_FILE:
      close(conn->endpoint.fd);
      break;
    case EP_CGI:
    case EP_PROXY:
      if (conn->endpoint.nc != NULL) {
        DBG(("%p %p %p :-)", conn, conn->ns_conn, conn->endpoint.nc));
        conn->endpoint.nc->flags |= NSF_CLOSE_IMMEDIATELY;
        conn->endpoint.nc->user_data = NULL;
      }
      break;
    default: break;
  }

#ifndef MONGOOSE_NO_LOGGING
  if (c->status_code > 0 && conn->endpoint_type != EP_CLIENT &&
      c->status_code != 400) {
    log_access(conn, conn->server->config_options[ACCESS_LOG_FILE]);
  }
#endif

  // Gobble possible POST data sent to the URI handler
  iobuf_free(&conn->ns_conn->recv_iobuf);
  free(conn->request);
  free(conn->path_info);
  conn->endpoint.nc = NULL;
  conn->request = conn->path_info = NULL;

  conn->endpoint_type = EP_NONE;
  conn->cl = conn->num_bytes_recv = conn->request_len = 0;
  conn->ns_conn->flags &= ~(NSF_FINISHED_SENDING_DATA |
                            NSF_BUFFER_BUT_DONT_SEND | NSF_CLOSE_IMMEDIATELY |
                            MG_HEADERS_SENT | MG_LONG_RUNNING);

  // Do not memset() the whole structure, as some of the fields
  // (IP addresses & ports, server_param) must survive. Nullify the rest.
  c->request_method = c->uri = c->http_version = c->query_string = NULL;
  c->num_headers = c->status_code = c->is_websocket = c->content_len = 0;
  c->connection_param = c->callback_param = NULL;

  if (keep_alive) {
    on_recv_data(conn);  // Can call us recursively if pipelining is used
  } else {
    conn->ns_conn->flags |= conn->ns_conn->send_iobuf.len == 0 ?
      NSF_CLOSE_IMMEDIATELY : NSF_FINISHED_SENDING_DATA;
  }
}